

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_value_numbering.cpp
# Opt level: O3

string * __thiscall
mocker::LocalValueNumbering::hash_abi_cxx11_
          (string *__return_storage_ptr__,LocalValueNumbering *this,
          shared_ptr<mocker::ir::IRInst> *inst,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *valueNumbers)

{
  InstType IVar1;
  ulong *puVar2;
  ulong __val;
  element_type *peVar3;
  pointer pcVar4;
  bool bVar5;
  undefined4 uVar6;
  pointer pbVar7;
  char cVar8;
  OpType OVar9;
  int iVar10;
  undefined8 *puVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  long *plVar13;
  byte bVar14;
  ulong uVar15;
  pointer ppVar16;
  size_type *psVar17;
  long lVar18;
  char cVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong *puVar23;
  string *psVar24;
  pointer pbVar25;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vnStr;
  OpType op;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string *local_330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_308;
  undefined1 *local_300;
  undefined8 local_2f8;
  undefined1 local_2f0;
  undefined1 uStack_2ef;
  undefined1 uStack_2ee;
  undefined5 uStack_2ed;
  undefined2 uStack_2e8;
  undefined4 uStack_2e6;
  undefined1 local_2e1;
  undefined1 *local_2e0;
  undefined8 local_2d8;
  undefined1 local_2d0;
  undefined1 uStack_2cf;
  undefined1 uStack_2ce;
  undefined5 uStack_2cd;
  undefined2 uStack_2c8;
  undefined4 uStack_2c6;
  undefined1 uStack_2c1;
  undefined1 *local_2c0;
  undefined8 local_2b8;
  undefined1 local_2b0;
  undefined1 uStack_2af;
  undefined6 uStack_2ae;
  undefined4 local_2a6;
  undefined2 local_2a2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_2a0;
  undefined1 *local_298;
  undefined8 local_290;
  undefined1 local_288;
  undefined1 uStack_287;
  undefined1 uStack_286;
  undefined5 uStack_285;
  undefined2 uStack_280;
  undefined4 uStack_27e;
  undefined1 local_279;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268;
  undefined1 uStack_267;
  undefined1 uStack_266;
  undefined5 uStack_265;
  undefined4 local_25d;
  undefined1 local_259;
  initializer_list<std::pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228;
  undefined1 uStack_227;
  undefined6 uStack_226;
  undefined4 local_21e;
  undefined2 local_21a;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  undefined2 uStack_1f8;
  undefined4 uStack_1f6;
  char cStack_1f2;
  char cStack_1f1;
  undefined4 local_1f0;
  undefined2 *local_1e8;
  undefined8 local_1e0;
  undefined2 local_1d8;
  undefined1 local_1d6;
  undefined7 uStack_1d5;
  undefined4 uStack_1ce;
  undefined1 local_1c9;
  undefined4 local_1c8;
  shared_ptr<mocker::ir::Addr> *local_1c0;
  undefined8 local_1b8;
  shared_ptr<mocker::ir::Addr> local_1b0;
  undefined4 local_1a0;
  undefined2 *local_198;
  undefined8 local_190;
  undefined2 local_188;
  undefined1 local_186;
  undefined7 uStack_185;
  undefined4 local_17e;
  undefined1 uStack_179;
  undefined4 local_178;
  undefined2 *local_170;
  undefined8 local_168;
  undefined2 local_160;
  undefined1 uStack_15e;
  undefined4 local_155;
  undefined1 local_151;
  undefined4 local_150;
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 local_138 [10];
  undefined4 uStack_12e;
  undefined1 local_129;
  undefined4 local_128;
  undefined2 *local_120;
  undefined8 local_118;
  undefined2 local_110 [5];
  undefined4 local_106;
  undefined2 local_102;
  undefined4 local_100;
  undefined2 *local_f8;
  undefined8 local_f0;
  undefined2 local_e8 [5];
  undefined4 local_de;
  undefined2 local_da;
  undefined4 local_d8;
  undefined2 *local_d0;
  undefined8 local_c8;
  undefined2 local_c0 [5];
  undefined4 local_b6;
  undefined2 local_b2;
  undefined4 local_b0;
  long *local_a8;
  undefined8 local_a0;
  undefined2 local_98 [5];
  undefined4 local_8e;
  undefined2 local_8a;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined1 uStack_6f;
  undefined6 uStack_6e;
  undefined4 local_66;
  undefined2 local_62;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined1 uStack_4f;
  undefined6 uStack_4e;
  undefined4 local_46;
  undefined2 local_42;
  initializer_list<std::pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)(valueNumbers->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(valueNumbers->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  local_330 = __return_storage_ptr__;
  local_308 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)inst;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_328,(size_type)paVar20);
  puVar23 = (valueNumbers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (valueNumbers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  local_2a0 = valueNumbers;
  if (puVar23 != puVar2) {
    do {
      __val = *puVar23;
      cVar19 = '\x01';
      if (9 < __val) {
        uVar15 = __val;
        cVar8 = '\x04';
        do {
          cVar19 = cVar8;
          if (uVar15 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_0016a074;
          }
          if (uVar15 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_0016a074;
          }
          if (uVar15 < 10000) goto LAB_0016a074;
          bVar5 = 99999 < uVar15;
          uVar15 = uVar15 / 10000;
          cVar8 = cVar19 + '\x04';
        } while (bVar5);
        cVar19 = cVar19 + '\x01';
      }
LAB_0016a074:
      local_218._M_allocated_capacity = (size_type)&local_208;
      std::__cxx11::string::_M_construct((ulong)&local_218,cVar19);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_218._M_allocated_capacity,local_218._8_4_,__val);
      paVar20 = &local_218;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_allocated_capacity != &local_208) {
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_208._M_allocated_capacity + 1);
        operator_delete((void *)local_218._M_allocated_capacity,(ulong)paVar20);
      }
      puVar23 = puVar23 + 1;
    } while (puVar23 != puVar2);
  }
  psVar24 = local_330;
  peVar3 = ((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
           &local_308->_vptr__Sp_counted_base)->_M_ptr;
  switch(peVar3->type) {
  case Assign:
    this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_308->_M_use_count)->_M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    hash_abi_cxx11_(local_330,(LocalValueNumbering *)paVar20,
                    (shared_ptr<mocker::ir::Addr> *)&peVar3[2].type);
    break;
  case ArithUnaryInst:
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_308->_M_use_count;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    bVar14 = 0x7e;
    if (peVar3[2].type == Deleted) {
      bVar14 = 0x2d;
    }
    local_218._8_8_ = (char *)0x1;
    local_208._M_local_buf[1] = 0;
    local_208._M_local_buf[0] = bVar14;
    local_218._M_allocated_capacity = (size_type)&local_208;
    if (local_328.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_328.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0016b0ca:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      goto LAB_0016b0dc;
    }
    plVar13 = (long *)std::__cxx11::string::_M_append
                                (local_218._M_local_buf,
                                 (ulong)((local_328.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p);
    (psVar24->_M_dataplus)._M_p = (pointer)&psVar24->field_2;
    psVar17 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar17) {
      lVar18 = plVar13[3];
      (psVar24->field_2)._M_allocated_capacity = *psVar17;
      *(long *)((long)&psVar24->field_2 + 8) = lVar18;
    }
    else {
      (psVar24->_M_dataplus)._M_p = (pointer)*plVar13;
      (psVar24->field_2)._M_allocated_capacity = *psVar17;
    }
    psVar24->_M_string_length = plVar13[1];
    *plVar13 = (long)psVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    uVar21 = local_208._M_allocated_capacity;
    uVar22 = local_218._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_allocated_capacity != &local_208) goto LAB_0016a789;
    break;
  case ArithBinaryInst:
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_308->_M_use_count;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if ((hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
         ::names_abi_cxx11_ == '\0') &&
       (iVar10 = __cxa_guard_acquire(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                      ::names_abi_cxx11_), iVar10 != 0)) {
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      local_350.field_2._M_local_buf[1] = '\0';
      local_218._8_8_ = local_208._M_local_buf + 8;
      local_218._M_allocated_capacity = local_218._M_allocated_capacity & 0xffffffff00000000;
      local_208._8_2_ = 0x7c;
      local_208._M_local_buf[10] = local_350.field_2._M_local_buf[2];
      local_208._M_local_buf[0xb] = (char)local_350.field_2._M_allocated_capacity._3_5_;
      local_208._12_4_ = (undefined4)((uint5)local_350.field_2._3_5_ >> 8);
      uStack_1f8 = local_350.field_2._8_2_;
      uStack_1f6 = local_350.field_2._10_4_;
      cStack_1f2 = local_350.field_2._M_local_buf[0xe];
      cStack_1f1 = local_350.field_2._M_local_buf[0xf];
      local_208._M_allocated_capacity = 1;
      local_350._M_string_length = 0;
      local_350.field_2._M_local_buf[0] = '\0';
      local_300 = &local_2f0;
      uStack_2ef = 0;
      local_1f0 = 1;
      local_1e8 = &local_1d8;
      local_1d8 = 0x26;
      local_1d6 = uStack_2ee;
      uStack_1d5 = (undefined7)(CONCAT26(uStack_2e8,CONCAT51(uStack_2ed,uStack_2ee)) >> 8);
      uStack_1ce = uStack_2e6;
      local_1c9 = local_2e1;
      local_1e0 = 1;
      local_2f8 = 0;
      local_2f0 = 0;
      local_2c0 = &local_2b0;
      uStack_2af = 0;
      local_1c8 = 2;
      local_1c0 = &local_1b0;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ = 0x5e
      ;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _2_4_ = local_2a6;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _6_2_ = local_2a2;
      local_1b8 = 1;
      local_2b8 = 0;
      local_2b0 = 0;
      local_2e0 = &local_2d0;
      uStack_2cf = 0x3c;
      uStack_2ce = 0;
      local_1a0 = 3;
      local_198 = &local_188;
      local_188 = 0x3c3c;
      local_186 = 0;
      uStack_185 = CONCAT25(uStack_2c8,uStack_2cd);
      local_17e = uStack_2c6;
      uStack_179 = uStack_2c1;
      local_190 = 2;
      local_2d8 = 0;
      local_2d0 = 0;
      local_278 = &local_268;
      uStack_267 = 0x3e;
      uStack_266 = 0;
      local_178 = 4;
      local_170 = &local_160;
      local_160 = 0x3e3e;
      uStack_15e = 0;
      local_155 = local_25d;
      local_151 = local_259;
      local_168 = 2;
      local_270 = 0;
      local_268 = 0;
      local_298 = &local_288;
      uStack_287 = 0;
      local_150 = 5;
      local_148 = local_138;
      local_138._0_2_ = 0x2b;
      local_138[2] = uStack_286;
      local_138._3_7_ = (undefined7)(CONCAT26(uStack_280,CONCAT51(uStack_285,uStack_286)) >> 8);
      uStack_12e = uStack_27e;
      local_129 = local_279;
      local_140 = 1;
      local_290 = 0;
      local_288 = 0;
      local_258._M_array = (iterator)&local_248;
      local_248._M_local_buf[1] = '\0';
      local_128 = 6;
      local_120 = local_110;
      local_110[0] = 0x2d;
      local_106 = local_248._10_4_;
      local_102 = local_248._14_2_;
      local_118 = 1;
      local_258._M_len = 0;
      local_248._M_local_buf[0] = '\0';
      local_238 = &local_228;
      uStack_227 = 0;
      local_100 = 7;
      local_f8 = local_e8;
      local_e8[0] = 0x2a;
      local_de = local_21e;
      local_da = local_21a;
      local_f0 = 1;
      local_230 = 0;
      local_228 = 0;
      uStack_4f = 0;
      local_d8 = 8;
      local_d0 = local_c0;
      local_c0[0] = 0x2f;
      local_b6 = local_46;
      local_b2 = local_42;
      local_c8 = 1;
      local_58 = 0;
      local_50 = 0;
      uStack_6f = 0;
      local_b0 = 9;
      local_a8 = (long *)local_98;
      local_98[0] = 0x25;
      local_8e = local_66;
      local_8a = local_62;
      local_a0 = 1;
      local_78 = 0;
      local_70 = 0;
      local_40._M_array = (iterator)&local_218;
      local_40._M_len = 10;
      local_80 = &local_70;
      local_60 = &local_50;
      SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::SmallMap(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                  ::names_abi_cxx11_,&local_40);
      lVar18 = -400;
      plVar13 = (long *)local_98;
      do {
        if (plVar13 != (long *)plVar13[-2]) {
          operator_delete((long *)plVar13[-2],*plVar13 + 1);
        }
        plVar13 = plVar13 + -5;
        lVar18 = lVar18 + 0x28;
      } while (lVar18 != 0);
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT62(uStack_6e,CONCAT11(uStack_6f,local_70)) + 1);
      }
      if (local_60 != &local_50) {
        operator_delete(local_60,CONCAT62(uStack_4e,CONCAT11(uStack_4f,local_50)) + 1);
      }
      if (local_238 != &local_228) {
        operator_delete(local_238,CONCAT62(uStack_226,CONCAT11(uStack_227,local_228)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_array != &local_248) {
        operator_delete(local_258._M_array,
                        CONCAT62(local_248._M_allocated_capacity._2_6_,
                                 CONCAT11(local_248._M_local_buf[1],local_248._M_local_buf[0])) + 1)
        ;
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,
                        CONCAT53(uStack_285,CONCAT12(uStack_286,CONCAT11(uStack_287,local_288))) + 1
                       );
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,
                        CONCAT53(uStack_265,CONCAT12(uStack_266,CONCAT11(uStack_267,local_268))) + 1
                       );
      }
      if (local_2e0 != &local_2d0) {
        operator_delete(local_2e0,
                        CONCAT53(uStack_2cd,CONCAT12(uStack_2ce,CONCAT11(uStack_2cf,local_2d0))) + 1
                       );
      }
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0,CONCAT62(uStack_2ae,CONCAT11(uStack_2af,local_2b0)) + 1);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300,
                        CONCAT53(uStack_2ed,CONCAT12(uStack_2ee,CONCAT11(uStack_2ef,local_2f0))) + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,
                        CONCAT53(local_350.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_350.field_2._M_local_buf[2],
                                          CONCAT11(local_350.field_2._M_local_buf[1],
                                                   local_350.field_2._M_local_buf[0]))) + 1);
      }
      __cxa_atexit(SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::~SmallMap,
                   &hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                    ::names_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                           ::names_abi_cxx11_);
      psVar24 = local_330;
    }
    if ((hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
         ::associative == '\0') &&
       (iVar10 = __cxa_guard_acquire(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                      ::associative), iVar10 != 0)) {
      local_350._M_dataplus._M_p = (pointer)&local_218;
      local_218._M_allocated_capacity = 0;
      local_218._8_8_ = (char *)0x1;
      local_208._M_allocated_capacity = 2;
      local_208._8_2_ = 5;
      local_208._M_local_buf[10] = '\0';
      local_208._M_local_buf[0xb] = '\0';
      local_208._12_4_ = 0;
      uStack_1f8 = 7;
      uStack_1f6 = 0;
      cStack_1f2 = '\0';
      cStack_1f1 = '\0';
      local_350._M_string_length = 5;
      SmallMap<mocker::ir::ArithBinaryInst::OpType,_int>::SmallMap
                (&hash::associative,
                 (initializer_list<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>_> *)
                 &local_350);
      __cxa_atexit(SmallMap<mocker::ir::ArithBinaryInst::OpType,_int>::~SmallMap,&hash::associative,
                   &__dso_handle);
      __cxa_guard_release(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                           ::associative);
      psVar24 = local_330;
    }
    if ((long)local_328.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_328.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
      __assert_fail("vnStr.size() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/local_value_numbering.cpp"
                    ,0x6a,
                    "std::string mocker::LocalValueNumbering::hash(const std::shared_ptr<ir::IRInst> &, const std::vector<std::size_t> &)"
                   );
    }
    OVar9 = peVar3[2].type;
    for (ppVar16 = hash::associative.mp.
                   super__Vector_base<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>,_std::allocator<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppVar16 !=
        hash::associative.mp.
        super__Vector_base<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>,_std::allocator<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppVar16 = ppVar16 + 1) {
      if (ppVar16->first == OVar9) {
        puVar23 = (local_2a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (puVar23[1] < *puVar23) {
          std::__cxx11::string::swap
                    ((string *)
                     local_328.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          OVar9 = peVar3[2].type;
        }
        break;
      }
    }
    local_300 = (undefined1 *)CONCAT44(local_300._4_4_,OVar9);
    pbVar12 = SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::at(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                    ::names_abi_cxx11_,(OpType *)&local_300);
    if (local_328.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_328.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) goto LAB_0016b0ca;
    std::operator+(&local_350,pbVar12,
                   local_328.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_350);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 == paVar20) {
      local_208._M_allocated_capacity = paVar20->_M_allocated_capacity;
      uVar6 = (undefined4)plVar13[3];
      local_208._12_4_ = *(undefined4 *)((long)plVar13 + 0x1c);
      local_208._8_2_ = (undefined2)uVar6;
      local_208._M_local_buf[10] = (char)((uint)uVar6 >> 0x10);
      local_208._M_local_buf[0xb] = (char)((uint)uVar6 >> 0x18);
      local_218._M_allocated_capacity = (size_type)&local_208;
    }
    else {
      local_208._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_218._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar13;
    }
    local_218._8_8_ = plVar13[1];
    *plVar13 = (long)paVar20;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if (1 < (ulong)((long)local_328.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_328.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      plVar13 = (long *)std::__cxx11::string::_M_append
                                  (local_218._M_local_buf,
                                   (ulong)local_328.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus.
                                          _M_p);
      (psVar24->_M_dataplus)._M_p = (pointer)&psVar24->field_2;
      psVar17 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar17) {
        lVar18 = plVar13[3];
        (psVar24->field_2)._M_allocated_capacity = *psVar17;
        *(long *)((long)&psVar24->field_2 + 8) = lVar18;
      }
      else {
        (psVar24->_M_dataplus)._M_p = (pointer)*plVar13;
        (psVar24->field_2)._M_allocated_capacity = *psVar17;
      }
      psVar24->_M_string_length = plVar13[1];
      *plVar13 = (long)psVar17;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_allocated_capacity != &local_208) goto LAB_0016a766;
      goto LAB_0016a776;
    }
LAB_0016b0dc:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_0016b0ef:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/local_value_numbering.cpp"
                  ,0x86,
                  "std::string mocker::LocalValueNumbering::hash(const std::shared_ptr<ir::IRInst> &, const std::vector<std::size_t> &)"
                 );
  case RelationInst:
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_308->_M_use_count;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if ((hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
         ::names_abi_cxx11_ == '\0') &&
       (iVar10 = __cxa_guard_acquire(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                      ::names_abi_cxx11_), iVar10 != 0)) {
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      local_350.field_2._M_local_buf[1] = '=';
      local_350.field_2._M_local_buf[2] = '\0';
      local_218._8_8_ = local_208._M_local_buf + 8;
      local_218._M_allocated_capacity = local_218._M_allocated_capacity & 0xffffffff00000000;
      local_208._8_2_ = 0x3d3d;
      local_208._M_local_buf[10] = '\0';
      local_208._M_local_buf[0xb] = (char)local_350.field_2._M_allocated_capacity._3_5_;
      local_208._12_4_ = (undefined4)((uint5)local_350.field_2._3_5_ >> 8);
      uStack_1f8 = local_350.field_2._8_2_;
      uStack_1f6 = local_350.field_2._10_4_;
      cStack_1f2 = local_350.field_2._M_local_buf[0xe];
      cStack_1f1 = local_350.field_2._M_local_buf[0xf];
      local_208._M_allocated_capacity = 2;
      local_350._M_string_length = 0;
      local_350.field_2._M_local_buf[0] = '\0';
      local_300 = &local_2f0;
      uStack_2ef = 0x3d;
      uStack_2ee = 0;
      local_1f0 = 1;
      local_1e8 = &local_1d8;
      local_1d8 = 0x3d21;
      local_1d6 = 0;
      uStack_1d5 = CONCAT25(uStack_2e8,uStack_2ed);
      uStack_1ce = uStack_2e6;
      local_1c9 = local_2e1;
      local_1e0 = 2;
      local_2f8 = 0;
      local_2f0 = 0;
      local_2c0 = &local_2b0;
      uStack_2af = 0;
      local_1c8 = 2;
      local_1c0 = &local_1b0;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ = 0x3c
      ;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _2_4_ = local_2a6;
      local_1b0.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _6_2_ = local_2a2;
      local_1b8 = 1;
      local_2b8 = 0;
      local_2b0 = 0;
      local_2e0 = &local_2d0;
      uStack_2cf = 0;
      local_1a0 = 3;
      local_198 = &local_188;
      local_188 = 0x3e;
      local_186 = uStack_2ce;
      uStack_185 = (undefined7)(CONCAT26(uStack_2c8,CONCAT51(uStack_2cd,uStack_2ce)) >> 8);
      local_17e = uStack_2c6;
      uStack_179 = uStack_2c1;
      local_190 = 1;
      local_2d8 = 0;
      local_2d0 = 0;
      uStack_267 = 0x3d;
      uStack_266 = 0;
      local_178 = 4;
      local_170 = &local_160;
      local_160 = 0x3d3c;
      uStack_15e = 0;
      local_155 = local_25d;
      local_151 = local_259;
      local_168 = 2;
      local_270 = 0;
      local_268 = 0;
      uStack_287 = 0x3d;
      uStack_286 = 0;
      local_150 = 5;
      local_148 = local_138;
      local_138._0_2_ = 0x3d3e;
      local_138[2] = 0;
      local_138._3_7_ = CONCAT25(uStack_280,uStack_285);
      uStack_12e = uStack_27e;
      local_129 = local_279;
      local_140 = 2;
      local_290 = 0;
      local_288 = 0;
      local_258._M_array = (iterator)&local_218;
      local_258._M_len = 6;
      local_298 = &local_288;
      local_278 = &local_268;
      SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::SmallMap(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                  ::names_abi_cxx11_,&local_258);
      lVar18 = -0xf0;
      plVar13 = (long *)local_138;
      do {
        if (plVar13 != (long *)plVar13[-2]) {
          operator_delete((long *)plVar13[-2],*plVar13 + 1);
        }
        plVar13 = plVar13 + -5;
        lVar18 = lVar18 + 0x28;
      } while (lVar18 != 0);
      if (local_298 != &local_288) {
        operator_delete(local_298,
                        CONCAT53(uStack_285,CONCAT12(uStack_286,CONCAT11(uStack_287,local_288))) + 1
                       );
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,
                        CONCAT53(uStack_265,CONCAT12(uStack_266,CONCAT11(uStack_267,local_268))) + 1
                       );
      }
      if (local_2e0 != &local_2d0) {
        operator_delete(local_2e0,
                        CONCAT53(uStack_2cd,CONCAT12(uStack_2ce,CONCAT11(uStack_2cf,local_2d0))) + 1
                       );
      }
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0,CONCAT62(uStack_2ae,CONCAT11(uStack_2af,local_2b0)) + 1);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300,
                        CONCAT53(uStack_2ed,CONCAT12(uStack_2ee,CONCAT11(uStack_2ef,local_2f0))) + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,
                        CONCAT53(local_350.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_350.field_2._M_local_buf[2],
                                          CONCAT11(local_350.field_2._M_local_buf[1],
                                                   local_350.field_2._M_local_buf[0]))) + 1);
      }
      __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::~SmallMap,
                   &hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                    ::names_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                           ::names_abi_cxx11_);
      psVar24 = local_330;
    }
    if ((long)local_328.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_328.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
      __assert_fail("vnStr.size() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/local_value_numbering.cpp"
                    ,0x74,
                    "std::string mocker::LocalValueNumbering::hash(const std::shared_ptr<ir::IRInst> &, const std::vector<std::size_t> &)"
                   );
    }
    IVar1 = peVar3[2].type;
    local_300 = (undefined1 *)CONCAT44(local_300._4_4_,IVar1);
    if (IVar1 == ArithBinaryInst) {
      std::operator+(&local_350,"<=",
                     local_328.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
      local_218._M_allocated_capacity = (size_type)&local_208;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 == paVar20) {
        local_208._M_allocated_capacity = paVar20->_M_allocated_capacity;
        uVar21 = puVar11[3];
        local_208._8_2_ = (undefined2)uVar21;
        local_208._M_local_buf[10] = (char)((ulong)uVar21 >> 0x10);
        local_208._M_local_buf[0xb] = (char)((ulong)uVar21 >> 0x18);
        local_208._12_4_ = (undefined4)((ulong)uVar21 >> 0x20);
      }
      else {
        local_208._M_allocated_capacity = paVar20->_M_allocated_capacity;
        local_218._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar11;
      }
      local_218._8_8_ = puVar11[1];
      *puVar11 = paVar20;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::_M_append
                                  (local_218._M_local_buf,
                                   (ulong)((local_328.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p);
    }
    else if (IVar1 == Assign) {
      std::operator+(&local_350,"<",
                     local_328.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
      local_218._M_allocated_capacity = (size_type)&local_208;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 == paVar20) {
        local_208._M_allocated_capacity = paVar20->_M_allocated_capacity;
        uVar21 = puVar11[3];
        local_208._8_2_ = (undefined2)uVar21;
        local_208._M_local_buf[10] = (char)((ulong)uVar21 >> 0x10);
        local_208._M_local_buf[0xb] = (char)((ulong)uVar21 >> 0x18);
        local_208._12_4_ = (undefined4)((ulong)uVar21 >> 0x20);
      }
      else {
        local_208._M_allocated_capacity = paVar20->_M_allocated_capacity;
        local_218._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar11;
      }
      local_218._8_8_ = puVar11[1];
      *puVar11 = paVar20;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::_M_append
                                  (local_218._M_local_buf,
                                   (ulong)((local_328.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p);
    }
    else {
      if ((IVar1 < AttachedComment) &&
         (puVar23 = (local_2a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start, puVar23[1] < *puVar23)) {
        std::__cxx11::string::swap
                  ((string *)
                   local_328.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      pbVar12 = SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::at(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                      ::names_abi_cxx11_,(OpType *)&local_300);
      std::operator+(&local_350,pbVar12,
                     local_328.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
      local_218._M_allocated_capacity = (size_type)&local_208;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 == paVar20) {
        local_208._M_allocated_capacity = paVar20->_M_allocated_capacity;
        uVar21 = puVar11[3];
        local_208._8_2_ = (undefined2)uVar21;
        local_208._M_local_buf[10] = (char)((ulong)uVar21 >> 0x10);
        local_208._M_local_buf[0xb] = (char)((ulong)uVar21 >> 0x18);
        local_208._12_4_ = (undefined4)((ulong)uVar21 >> 0x20);
      }
      else {
        local_208._M_allocated_capacity = paVar20->_M_allocated_capacity;
        local_218._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar11;
      }
      local_218._8_8_ = puVar11[1];
      *puVar11 = paVar20;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::_M_append
                                  (local_218._M_local_buf,
                                   (ulong)local_328.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus.
                                          _M_p);
    }
    (psVar24->_M_dataplus)._M_p = (pointer)&psVar24->field_2;
    psVar17 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar17) {
      lVar18 = plVar13[3];
      (psVar24->field_2)._M_allocated_capacity = *psVar17;
      *(long *)((long)&psVar24->field_2 + 8) = lVar18;
    }
    else {
      (psVar24->_M_dataplus)._M_p = (pointer)*plVar13;
      (psVar24->field_2)._M_allocated_capacity = *psVar17;
    }
    psVar24->_M_string_length = plVar13[1];
    *plVar13 = (long)psVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_allocated_capacity != &local_208) {
LAB_0016a766:
      operator_delete((void *)local_218._M_allocated_capacity,local_208._M_allocated_capacity + 1);
    }
LAB_0016a776:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      uVar21 = CONCAT53(local_350.field_2._M_allocated_capacity._3_5_,
                        CONCAT12(local_350.field_2._M_local_buf[2],
                                 CONCAT11(local_350.field_2._M_local_buf[1],
                                          local_350.field_2._M_local_buf[0])));
      uVar22 = local_350._M_dataplus._M_p;
LAB_0016a789:
      operator_delete((void *)uVar22,uVar21 + 1);
    }
    break;
  default:
    if (peVar3->type != Phi) goto LAB_0016b0ef;
    local_308 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_308->_M_use_count)->_M_pi;
    if (local_308 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_308->_M_use_count)->_M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_308->_M_use_count)->
                      _M_pi + 1;
        UNLOCK();
      }
      else {
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_308->_M_use_count)->_M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_308->_M_use_count)->
                      _M_pi + 1;
      }
    }
    (local_330->_M_dataplus)._M_p = (pointer)&local_330->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"phi,","");
    pbVar7 = local_328.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_328.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_328.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar25 = local_328.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar4 = (pbVar25->_M_dataplus)._M_p;
        local_218._M_allocated_capacity = (size_type)&local_208;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,pcVar4,pcVar4 + pbVar25->_M_string_length);
        std::__cxx11::string::append(local_218._M_local_buf);
        std::__cxx11::string::_M_append((char *)local_330,local_218._M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_allocated_capacity != &local_208) {
          operator_delete((void *)local_218._M_allocated_capacity,
                          local_208._M_allocated_capacity + 1);
        }
        pbVar25 = pbVar25 + 1;
      } while (pbVar25 != pbVar7);
    }
    this_00 = local_308;
    psVar24 = local_330;
    if (local_308 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0016a79e;
    goto LAB_0016a796;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0016a796:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_0016a79e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328);
  return psVar24;
}

Assistant:

std::string
LocalValueNumbering::hash(const std::shared_ptr<ir::IRInst> &inst,
                          const std::vector<std::size_t> &valueNumbers) {
  using namespace std::string_literals;
  std::vector<std::string> vnStr;
  vnStr.reserve(valueNumbers.size());
  for (auto valueNumber : valueNumbers)
    vnStr.emplace_back(std::to_string(valueNumber));

  if (auto p = ir::dyc<ir::Assign>(inst)) {
    return hash(p->getOperand());
  }
  if (auto p = ir::dyc<ir::ArithUnaryInst>(inst)) {
    return (p->getOp() == ir::ArithUnaryInst::Neg ? "-"s : "~"s) + vnStr.at(0);
  }
  if (auto p = ir::dyc<ir::ArithBinaryInst>(inst)) {
    static const SmallMap<ir::ArithBinaryInst::OpType, std::string> names{
        {ir::ArithBinaryInst::BitOr, "|"s}, {ir::ArithBinaryInst::BitAnd, "&"s},
        {ir::ArithBinaryInst::Xor, "^"s},   {ir::ArithBinaryInst::Shl, "<<"s},
        {ir::ArithBinaryInst::Shr, ">>"s},  {ir::ArithBinaryInst::Add, "+"s},
        {ir::ArithBinaryInst::Sub, "-"s},   {ir::ArithBinaryInst::Mul, "*"s},
        {ir::ArithBinaryInst::Div, "/"s},   {ir::ArithBinaryInst::Mod, "%"s}};
    static const SmallMap<ir::ArithBinaryInst::OpType, int> associative{
        {ir::ArithBinaryInst::BitOr, 0}, {ir::ArithBinaryInst::BitAnd, 0},
        {ir::ArithBinaryInst::Xor, 0},   {ir::ArithBinaryInst::Add, 0},
        {ir::ArithBinaryInst::Mul, 0},
    };
    assert(vnStr.size() == 2);
    if (associative.in(p->getOp()) && valueNumbers[0] > valueNumbers[1])
      std::swap(vnStr[0], vnStr[1]);
    return names.at(p->getOp()) + vnStr.at(0) + "," + vnStr.at(1);
  }
  if (auto p = ir::dyc<ir::RelationInst>(inst)) {
    static const SmallMap<ir::RelationInst::OpType, std::string> names{
        {ir::RelationInst::Eq, "=="s}, {ir::RelationInst::Ne, "!="s},
        {ir::RelationInst::Lt, "<"s},  {ir::RelationInst::Gt, ">"s},
        {ir::RelationInst::Le, "<="s}, {ir::RelationInst::Ge, ">="s}};
    assert(vnStr.size() == 2);
    auto op = p->getOp();
    if (op == ir::RelationInst::Gt)
      return "<" + vnStr[1] + "," + vnStr[0];
    if (op == ir::RelationInst::Ge)
      return "<=" + vnStr[1] + "," + vnStr[0];

    if ((op == ir::RelationInst::Eq || op == ir::RelationInst::Ne) &&
        valueNumbers[0] > valueNumbers[1])
      std::swap(vnStr[0], vnStr[1]);
    return names.at(op) + vnStr[0] + "," + vnStr[1];
  }
  if (auto p = ir::dyc<ir::Phi>(inst)) {
    std::string res = "phi,";
    for (auto &s : vnStr)
      res += s + ",";
    return res;
  }
  assert(false);
}